

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicSharedStruct::Run(BasicSharedStruct *this)

{
  bool bVar1;
  GLuint GVar2;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  BasicSharedStruct *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 128) in;\nlayout(std430) buffer Output {\n  vec4 g_output[256];\n};\nstruct SubData {\n  mat2x4 data;\n};\nstruct Data {\n  uint index;\n  vec3 data0;\n  SubData data1;\n};\nshared Data g_shared_data[256];\nshared int g_shared_buf[2];\nvoid main() {\n  if (gl_LocalInvocationID.x == 0) {\n    g_shared_buf[1] = 1;\n    g_shared_buf[1 + gl_LocalInvocationID.x] = 0;\n    g_shared_buf[0] = 128;\n    g_output[0] = vec4(g_shared_buf[1]);\n    g_output[128] = vec4(g_shared_buf[0]);\n    memoryBarrierBuffer();\n  } else {\n    const uint index = gl_LocalInvocationIndex;\n    g_shared_data[index].index = index;\n    g_shared_data[index + 128].index = index + 128;\n    g_shared_data[index].data1.data = mat2x4(0.0);\n    g_shared_data[index + 128].data1.data = mat2x4(0.0);\n    g_output[index] = vec4(g_shared_data[index].index);\n    g_output[index + 128] = vec4(g_shared_data[index + 128].index);\n    memoryBarrierShared();\n  }\n  memoryBarrierAtomicCounter();\n  memoryBarrierImage();\n  memoryBarrier();\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 128) in;\nlayout(std430) buffer Output {\n  vec4 g_output[256];\n};\nstruct SubData {\n  mat2x4 data;\n};\nstruct Data {\n  uint index;\n  vec3 data0;\n  SubData data1;\n};\nshared Data g_shared_data[256];\nshared int g_shared_buf[2];\nvoid main() {\n  if (gl_LocalInvocationID.x == 0) {\n    g_shared_buf[1] = 1;\n    g_shared_buf[1 + gl_LocalInvocationID.x] = 0;\n    g_shared_buf[0] = 128;\n    g_output[0] = vec4(g_shared_buf[1]);\n    g_output[128] = vec4(g_shared_buf[0]);\n    memoryBarrierBuffer();\n  } else {\n    const uint index = gl_LocalInvocationIndex;\n    g_shared_data[index].index = index;\n    g_shared_data[index + 128].index = index + 128;\n    g_shared_data[index].data1.data = mat2x4(0.0);\n    g_shared_data[index + 128].data1.data = mat2x4(0.0);\n    g_output[index] = vec4(g_shared_data[index].index);\n    g_output[index + 128] = vec4(g_shared_data[index + 128].index);\n    memoryBarrierShared();\n  }\n  memoryBarrierAtomicCounter();\n  memoryBarrierImage();\n  memoryBarrier();\n}"
             ,&local_41);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    bVar1 = RunIteration(this,false);
    if (bVar1) {
      bVar1 = RunIteration(this,true);
      if (bVar1) {
        this_local = (BasicSharedStruct *)0x0;
      }
      else {
        this_local = (BasicSharedStruct *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicSharedStruct *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicSharedStruct *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs = NL
			"layout(local_size_x = 128) in;" NL "layout(std430) buffer Output {" NL "  vec4 g_output[256];" NL "};" NL
			"struct SubData {" NL "  mat2x4 data;" NL "};" NL "struct Data {" NL "  uint index;" NL "  vec3 data0;" NL
			"  SubData data1;" NL "};" NL "shared Data g_shared_data[256];" NL "shared int g_shared_buf[2];" NL
			"void main() {" NL "  if (gl_LocalInvocationID.x == 0) {" NL "    g_shared_buf[1] = 1;" NL
			"    g_shared_buf[1 + gl_LocalInvocationID.x] = 0;" NL "    g_shared_buf[0] = 128;" NL
			"    g_output[0] = vec4(g_shared_buf[1]);" NL "    g_output[128] = vec4(g_shared_buf[0]);" NL
			"    memoryBarrierBuffer();" // note: this call is not needed here, just check if compiler accepts it
			NL "  } else {" NL "    const uint index = gl_LocalInvocationIndex;" NL
			"    g_shared_data[index].index = index;" NL "    g_shared_data[index + 128].index = index + 128;" NL
			"    g_shared_data[index].data1.data = mat2x4(0.0);" NL
			"    g_shared_data[index + 128].data1.data = mat2x4(0.0);" NL
			"    g_output[index] = vec4(g_shared_data[index].index);" // load data from shared memory
			NL "    g_output[index + 128] = vec4(g_shared_data[index + 128].index);" NL
			"    memoryBarrierShared();" // note: this call is not needed here, just check if compiler accepts it
			NL "  }" NL "  memoryBarrierAtomicCounter();" NL "  memoryBarrierImage();" NL
			"  memoryBarrier();" // note: these calls are not needed here, just check if compiler accepts them
			NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		if (!RunIteration(false))
			return ERROR;
		if (!RunIteration(true))
			return ERROR;
		return NO_ERROR;
	}